

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTAudioEngine_GetGlobalVariable(FACTAudioEngine *pEngine,uint16_t nIndex,float *pnValue)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  byte *pbVar4;
  undefined4 *in_RDX;
  ushort in_SI;
  long in_RDI;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FACTVariable *var;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x113e37);
  pbVar4 = (byte *)(*(long *)(in_RDI + 0x58) + (ulong)in_SI * 0x10);
  do {
    if ((*pbVar4 & 1) != 0) goto LAB_00113eaa;
    iVar2 = SDL_ReportAssertion(&FACTAudioEngine_GetGlobalVariable::sdl_assert_data,
                                "FACTAudioEngine_GetGlobalVariable",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                ,0x40d);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_00113eaa:
  do {
    if ((*pbVar4 & 4) == 0) goto LAB_00113efc;
    iVar2 = SDL_ReportAssertion(&FACTAudioEngine_GetGlobalVariable::sdl_assert_data_1,
                                "FACTAudioEngine_GetGlobalVariable",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                ,0x40e);
  } while (iVar2 == 0);
  if (iVar2 == 1) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return uVar3;
  }
LAB_00113efc:
  *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 0x90) + (ulong)in_SI * 4);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x113f2c);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_GetGlobalVariable(
	FACTAudioEngine *pEngine,
	uint16_t nIndex,
	float *pnValue
) {
	FACTVariable *var;

	FAudio_PlatformLockMutex(pEngine->apiLock);

	var = &pEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(!(var->accessibility & 0x04));
	*pnValue = pEngine->globalVariableValues[nIndex];

	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}